

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O3

void __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::qstring_trait_t>::parse
          (parser_conffile_impl_t<cfgfile::qstring_trait_t> *this,string_t *file_name)

{
  tag_t<cfgfile::qstring_trait_t> *ptVar1;
  tag_t<cfgfile::qstring_trait_t> **pptVar2;
  size_type sVar3;
  undefined8 uVar4;
  Data *pDVar5;
  char16_t *pcVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  bool bVar9;
  int iVar10;
  _Elt_pointer pptVar11;
  undefined4 extraout_var;
  logic_error *this_00;
  _Elt_pointer pptVar12;
  string local_230;
  undefined4 uStack_210;
  undefined4 uStack_20c;
  lexeme_t<cfgfile::qstring_trait_t> local_208;
  qstring_wrapper_t local_1e8;
  string local_1d0;
  string local_1b0;
  string_t local_190;
  string_t local_178;
  string_t local_160;
  string_t local_148;
  string_t local_130;
  string_t local_118;
  qstring_wrapper_t local_100;
  qstring_wrapper_t local_e8;
  qstring_wrapper_t local_d0;
  qstring_wrapper_t local_b8;
  qstring_wrapper_t local_a0;
  qstring_wrapper_t local_88;
  string local_70;
  string local_50;
  
  bVar9 = start_first_tag_parsing(this);
  if (bVar9) {
    lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme(&local_208,&this->m_lex);
    if (local_208.m_type != null) {
      do {
        pptVar11 = (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
                   super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pptVar11 ==
            (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
            super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur) {
          this_00 = (logic_error *)__cxa_allocate_exception(0x28);
          local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_230,
                     "Unexpected content. We\'ve finished parsing, but we\'ve got this: \"","");
          qstring_trait_t::from_ascii(&local_118,&local_230);
          operator+(&local_100,&local_118,&local_208.m_value);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"\". ","");
          qstring_trait_t::from_ascii(&local_130,&local_50);
          operator+(&local_e8,&local_100,&local_130);
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"In file \"","");
          qstring_trait_t::from_ascii(&local_148,&local_70);
          operator+(&local_d0,&local_e8,&local_148);
          operator+(&local_b8,&local_d0,file_name);
          local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"\" on line ","");
          qstring_trait_t::from_ascii(&local_160,&local_1b0);
          operator+(&local_a0,&local_b8,&local_160);
          qstring_trait_t::to_string(&local_178,(this->m_lex).m_line_number);
          operator+(&local_88,&local_a0,&local_178);
          local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,".","");
          qstring_trait_t::from_ascii(&local_190,&local_1d0);
          operator+(&local_1e8,&local_88,&local_190);
          std::logic_error::logic_error(this_00,"Please use desc() method of the exception.");
          *(undefined ***)this_00 = &PTR__exception_t_00121a28;
          *(undefined8 *)(this_00 + 0x20) = 0;
          uVar7 = local_1e8.m_str.d.d._0_4_;
          uVar8 = local_1e8.m_str.d.d._4_4_;
          local_1e8.m_str.d.d = (Data *)0x0;
          *(undefined4 *)(this_00 + 0x10) = uVar7;
          *(undefined4 *)(this_00 + 0x14) = uVar8;
          *(undefined4 *)(this_00 + 0x18) = local_1e8.m_str.d.ptr._0_4_;
          *(undefined4 *)(this_00 + 0x1c) = local_1e8.m_str.d.ptr._4_4_;
          local_1e8.m_str.d.ptr = (char16_t *)0x0;
          *(qsizetype *)(this_00 + 0x20) = local_1e8.m_str.d.size;
          local_1e8.m_str.d.size = 0;
          __cxa_throw(this_00,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
        if (local_208.m_type == start) {
          if (pptVar11 ==
              (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
              super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar2 = (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
                      super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
            pptVar12 = pptVar2 + 0x3f;
            pptVar11 = pptVar2 + 0x40;
          }
          else {
            pptVar12 = pptVar11 + -1;
          }
          ptVar1 = *pptVar12;
          iVar10 = (*pptVar11[-1]->_vptr_tag_t[2])();
          start_tag_parsing(this,ptVar1,(child_tags_list_t *)CONCAT44(extraout_var,iVar10));
        }
        else if (local_208.m_type == finish) {
          if (pptVar11 ==
              (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
              super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar11 = (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
                       super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ptVar1 = pptVar11[-1];
          local_230.field_2._8_8_ = (this->m_lex).m_line_number;
          uStack_210 = (undefined4)(this->m_lex).m_column_number;
          uStack_20c = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
          local_230._M_dataplus._M_p = (pointer)(file_name->m_str).d.d;
          local_230._M_string_length = (size_type)(file_name->m_str).d.ptr;
          local_230.field_2._M_allocated_capacity = (file_name->m_str).d.size;
          if ((QArrayData *)local_230._M_dataplus._M_p != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_230._M_dataplus._M_p)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_230._M_dataplus._M_p)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          (*ptVar1->_vptr_tag_t[6])(ptVar1,&local_230);
          if ((QArrayData *)local_230._M_dataplus._M_p != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_230._M_dataplus._M_p = *(int *)local_230._M_dataplus._M_p + -1;
            UNLOCK();
            if (*(int *)local_230._M_dataplus._M_p == 0) {
              QArrayData::deallocate((QArrayData *)local_230._M_dataplus._M_p,2,8);
            }
          }
          std::
          deque<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
          ::pop_back(&(this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c);
        }
        else if (local_208.m_type == string) {
          if (pptVar11 ==
              (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
              super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            pptVar11 = (this->super_parser_base_t<cfgfile::qstring_trait_t>).m_stack.c.
                       super__Deque_base<cfgfile::tag_t<cfgfile::qstring_trait_t>_*,_std::allocator<cfgfile::tag_t<cfgfile::qstring_trait_t>_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          ptVar1 = pptVar11[-1];
          local_230.field_2._8_8_ = (this->m_lex).m_line_number;
          uStack_210 = (undefined4)(this->m_lex).m_column_number;
          uStack_20c = *(undefined4 *)((long)&(this->m_lex).m_column_number + 4);
          local_230._M_dataplus._M_p = (pointer)(file_name->m_str).d.d;
          local_230._M_string_length = (size_type)(file_name->m_str).d.ptr;
          local_230.field_2._M_allocated_capacity = (file_name->m_str).d.size;
          if ((QArrayData *)local_230._M_dataplus._M_p != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&((QArrayData *)local_230._M_dataplus._M_p)->ref_)->ref_)._q_value.
            super___atomic_base<int>._M_i =
                 (((QArrayData *)&((QArrayData *)local_230._M_dataplus._M_p)->ref_)->ref_)._q_value.
                 super___atomic_base<int>._M_i + 1;
            UNLOCK();
          }
          (*ptVar1->_vptr_tag_t[7])(ptVar1,&local_230,&local_208.m_value);
          if ((QArrayData *)local_230._M_dataplus._M_p != (QArrayData *)0x0) {
            LOCK();
            *(int *)local_230._M_dataplus._M_p = *(int *)local_230._M_dataplus._M_p + -1;
            UNLOCK();
            if (*(int *)local_230._M_dataplus._M_p == 0) {
              QArrayData::deallocate((QArrayData *)local_230._M_dataplus._M_p,2,8);
            }
          }
        }
        lexical_analyzer_t<cfgfile::qstring_trait_t>::next_lexeme
                  ((lexeme_t<cfgfile::qstring_trait_t> *)&local_230,&this->m_lex);
        pcVar6 = local_208.m_value.m_str.d.ptr;
        pDVar5 = local_208.m_value.m_str.d.d;
        uVar4 = local_230.field_2._8_8_;
        sVar3 = local_230._M_string_length;
        local_208.m_type = (lexeme_type_t)local_230._M_dataplus._M_p;
        local_230._M_string_length = (size_type)local_208.m_value.m_str.d.d;
        local_208.m_value.m_str.d.d = (Data *)sVar3;
        local_208.m_value.m_str.d.ptr = (char16_t *)local_230.field_2._M_allocated_capacity;
        local_230.field_2._M_allocated_capacity = (size_type)pcVar6;
        local_230.field_2._8_8_ = local_208.m_value.m_str.d.size;
        local_208.m_value.m_str.d.size = uVar4;
        if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&pDVar5->super_QArrayData,2,8);
          }
        }
      } while (local_208.m_type != null);
    }
    parser_base_t<cfgfile::qstring_trait_t>::check_parser_state_after_parsing
              (&this->super_parser_base_t<cfgfile::qstring_trait_t>);
    if (&(local_208.m_value.m_str.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_208.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_208.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_208.m_value.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_208.m_value.m_str.d.d)->super_QArrayData,2,8);
      }
    }
  }
  return;
}

Assistant:

void parse( const typename Trait::string_t & file_name ) override
	{
		if( !start_first_tag_parsing() )
			return;

		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		while( !lexeme.is_null() )
		{
			if( !this->m_stack.empty() )
			{
				switch( lexeme.type() )
				{
					case lexeme_type_t::start :
						start_tag_parsing( *this->m_stack.top(),
							this->m_stack.top()->children() );
						break;

					case lexeme_type_t::string :
						this->m_stack.top()->on_string( parser_info_t< Trait >(
								file_name,
								m_lex.line_number(),
								m_lex.column_number() ),
							lexeme.value() );
						break;

					case lexeme_type_t::finish :
					{
						this->m_stack.top()->on_finish( parser_info_t< Trait >(
							file_name,
							m_lex.line_number(),
							m_lex.column_number() ) );
						this->m_stack.pop();
					}
						break;

					default:
						break;
				}
			}
			else
				throw exception_t< Trait >(
					Trait::from_ascii( "Unexpected content. "
						"We've finished parsing, but we've got this: \"" ) +
					lexeme.value() + Trait::from_ascii( "\". " ) +
					Trait::from_ascii( "In file \"" ) + file_name +
					Trait::from_ascii( "\" on line " ) +
					Trait::to_string( m_lex.line_number() ) +
					Trait::from_ascii( "." ) );


			lexeme = m_lex.next_lexeme();
		}

		this->check_parser_state_after_parsing();
	}